

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::TableauPileMock>
          (SolitaireEmptyHandTest *this,TableauPileMock *pile,StrictSnapshotMockPtr *snapshot)

{
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_00;
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_01;
  undefined1 local_78 [16];
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>_>
  local_68;
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  local_58;
  WithoutMatchers local_31;
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  local_30;
  StrictSnapshotMockPtr *local_20;
  StrictSnapshotMockPtr *snapshot_local;
  TableauPileMock *pile_local;
  SolitaireEmptyHandTest *this_local;
  
  local_20 = snapshot;
  snapshot_local = (StrictSnapshotMockPtr *)pile;
  pile_local = (TableauPileMock *)this;
  local_30.function_mocker_ =
       (FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
        *)piles::TableauPileMock::gmock_createSnapshot
                    ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                      *)pile,pile);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::operator()(&local_30,&local_31,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0xd4,"pile","createSnapshot()");
  mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_>::make_unique
            ((mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_> *)local_78);
  testing::
  ByMove<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>
            ((testing *)(local_78 + 8),
             (unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
              *)local_78);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>>
            ((testing *)&local_68,
             (ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
              *)(local_78 + 8));
  testing::internal::ReturnAction::operator_cast_to_Action(&local_58,(ReturnAction *)&local_68);
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::WillOnce(this_01,&local_58);
  testing::
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::~Action(&local_58);
  testing::internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>_>
  ::~ReturnAction(&local_68);
  testing::internal::
  ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
  ::~ByMoveWrapper((ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
                    *)(local_78 + 8));
  std::
  unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
  ::~unique_ptr((unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>
                 *)local_78);
  return;
}

Assistant:

void expectSnapshotCreation(Pile& pile, StrictSnapshotMockPtr& snapshot) {
        EXPECT_CALL(pile, createSnapshot())
            .WillOnce(Return(ByMove(snapshot.make_unique())));
    }